

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

TranslationBlock *
tb_htable_lookup_riscv64
          (CPUState *cpu,target_ulong pc,target_ulong cs_base,uint32_t flags,uint32_t cf_mask)

{
  uc_struct_conflict7 *uc;
  tb_page_addr_t tVar1;
  TranslationBlock *pTVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  tb_desc_conflict11 desc;
  target_ulong local_58;
  target_ulong local_50;
  CPUArchState_conflict26 *local_48;
  ulong local_40;
  uint32_t local_38;
  uint32_t local_34;
  undefined4 local_30;
  
  uc = cpu->uc;
  local_48 = (CPUArchState_conflict26 *)cpu->env_ptr;
  local_30 = (undefined4)cpu->trace_dstate[0];
  local_58 = pc;
  local_50 = cs_base;
  local_38 = flags;
  local_34 = cf_mask;
  tVar1 = get_page_addr_code_riscv64(local_48,pc);
  if (tVar1 == 0xffffffffffffffff) {
    pTVar2 = (TranslationBlock *)0x0;
  }
  else {
    local_40 = tVar1 & 0xfffffffffffff000;
    uVar3 = (int)pc * -0x7a143589 + 1;
    uVar4 = uVar3 * 0x2000 | uVar3 >> 0x13;
    uVar3 = (int)tVar1 * -0x7a143589 + 0x24234429;
    uVar3 = uVar3 * 0x2000 | uVar3 >> 0x13;
    uVar5 = (int)(tVar1 >> 0x20) * -0x7a143589 + 0x85ebca78;
    uVar5 = uVar5 * 0x2000 | uVar5 >> 0x13;
    uVar6 = (int)(pc >> 0x20) * -0x7a143589 + 0x61c88650;
    uVar6 = uVar6 * 0x2000 | uVar6 >> 0x13;
    uVar3 = (uVar5 * 0x1bbcd880 | uVar5 * -0x61c8864f >> 0x19) +
            flags * -0x3d4d51c3 + (uVar4 * 0x779b1000 | uVar4 * -0x61c8864f >> 0x14) +
            (uVar6 * -0x193c0000 | uVar6 * -0x61c8864f >> 0xe) +
            (uVar3 * 0x3c6ef362 | (uint)((int)(uVar3 * -0x61c8864f) < 0)) + 0x1c;
    uVar3 = cf_mask * -0x3d4d51c3 + (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
    uVar3 = (int)cpu->trace_dstate[0] * -0x3d4d51c3 + (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
    uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
    uVar3 = (uVar3 >> 0xf ^ uVar3) * -0x7a143589;
    uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51c3;
    pTVar2 = (TranslationBlock *)
             qht_lookup_custom((uc_struct_conflict5 *)uc,
                               (qht *)(cpu->uc->tcg_ctx->gen_insn_data[0xaa] + 2),&local_58,
                               uVar3 >> 0x10 ^ uVar3,tb_lookup_cmp);
  }
  return pTVar2;
}

Assistant:

TranslationBlock *tb_htable_lookup(CPUState *cpu, target_ulong pc,
                                   target_ulong cs_base, uint32_t flags,
                                   uint32_t cf_mask)
{
    struct uc_struct *uc = cpu->uc;
    tb_page_addr_t phys_pc;
    struct tb_desc desc;
    uint32_t h;

    desc.env = (CPUArchState *)cpu->env_ptr;
    desc.cs_base = cs_base;
    desc.flags = flags;
    desc.cf_mask = cf_mask;
    desc.trace_vcpu_dstate = *cpu->trace_dstate;
    desc.pc = pc;
    phys_pc = get_page_addr_code(desc.env, pc);
    if (phys_pc == -1) {
        return NULL;
    }
    desc.phys_page1 = phys_pc & TARGET_PAGE_MASK;
    h = tb_hash_func(phys_pc, pc, flags, cf_mask, *cpu->trace_dstate);
    return qht_lookup_custom(uc, &cpu->uc->tcg_ctx->tb_ctx.htable, &desc, h, tb_lookup_cmp);
}